

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O2

string * __thiscall
HammeringPattern::get_agg_access_pairs_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,HammeringPattern *this)

{
  string *psVar1;
  ostream *poVar2;
  int iVar3;
  uint uVar4;
  pointer this_00;
  stringstream local_1e8 [8];
  stringstream ss;
  undefined1 local_1d8 [376];
  string local_60;
  pointer local_40;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1e8);
  this_00 = (this->agg_access_patterns).
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->agg_access_patterns).
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  iVar3 = 0;
  while( true ) {
    psVar1 = local_38;
    if (this_00 == local_40) break;
    if ((iVar3 != 0) && (iVar3 + (uVar4 / 3) * 3 == 0)) {
      std::endl<char,std::char_traits<char>>((ostream *)local_1d8);
    }
    *(undefined8 *)(*(_func_int **)(local_1d8._0_8_ + -0x18) + (long)(local_1d8 + 0x10)) = 0x1e;
    poVar2 = std::operator<<(local_1d8,0x20);
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x20;
    AggressorAccessPattern::to_string_abi_cxx11_(&local_60,this_00);
    std::operator<<(poVar2,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = uVar4 + 1;
    this_00 = this_00 + 1;
    iVar3 = iVar3 + -1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1e8);
  return psVar1;
}

Assistant:

std::string HammeringPattern::get_agg_access_pairs_text_repr() {
  std::stringstream ss;
  auto cnt = 0;
  for (const auto &agg_acc_pair : agg_access_patterns) {
    // add a new line after each three aggressor access patterns to avoid unintended text wrapping in terminal
    if (cnt > 0 && cnt%3==0) ss << std::endl;
    ss << std::setw(30) << std::setfill(' ') << std::left << agg_acc_pair.to_string();
    cnt++;
  }
  return ss.str();
}